

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O1

ssize_t __thiscall cppwinrt::writer::write(writer *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  category cVar4;
  database *extraout_RAX;
  database *extraout_RAX_00;
  database *extraout_RAX_01;
  database *extraout_RAX_02;
  database *extraout_RAX_03;
  database *extraout_RAX_04;
  database *pdVar5;
  coded_index<winmd::reader::TypeOrMethodDef> *value;
  char *pcVar6;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_00;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_01;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_02;
  table_base *ptVar7;
  void *__buf_00;
  basic_string_view<char,_std::char_traits<char>_> *first;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_03;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_04;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_05;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_06;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_07;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_08;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_09;
  char *pcVar8;
  undefined4 in_register_00000034;
  row_base<winmd::reader::TypeDef> *this_00;
  pointer pcVar9;
  undefined1 *puVar10;
  size_type __rlen_10;
  size_type __rlen_3;
  size_type __rlen;
  bool bVar11;
  string_view ns;
  pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> generics;
  string_view local_168;
  string_view local_158;
  char *local_148;
  basic_string_view<char,_std::char_traits<char>_> *local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [40];
  database *local_100;
  _Variant_storage<false,_winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
  local_f0;
  pointer local_a8;
  pointer local_98;
  undefined1 local_90 [32];
  pair<winmd::reader::Field,_winmd::reader::Field> local_70;
  undefined1 local_50 [16];
  anon_class_16_2_560cd874 local_40;
  
  this_00 = (row_base<winmd::reader::TypeDef> *)CONCAT44(in_register_00000034,__fd);
  add_depends(this,(TypeDef *)this_00);
  pdVar5 = this_00->m_table->m_database;
  uVar2 = winmd::reader::table_base::get_value<unsigned_int>(this_00->m_table,this_00->m_index,2);
  local_158 = winmd::reader::database::get_string(pdVar5,uVar2);
  pdVar5 = this_00->m_table->m_database;
  uVar2 = winmd::reader::table_base::get_value<unsigned_int>(this_00->m_table,this_00->m_index,1);
  local_168 = winmd::reader::database::get_string(pdVar5,uVar2);
  local_138._0_8_ = this_00->m_table;
  local_138._8_4_ = this_00->m_index * 2 + 2;
  value = (coded_index<winmd::reader::TypeOrMethodDef> *)(ulong)(uint)local_138._8_4_;
  winmd::reader::
  equal_range<winmd::reader::table<winmd::reader::GenericParam>,winmd::reader::coded_index<winmd::reader::TypeOrMethodDef>>
            ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&local_70,
             (reader *)
             &((((database *)local_138._0_8_)->TypeRef).super_table_base.m_database)->GenericParam,
             (table<winmd::reader::GenericParam> *)local_138,value);
  sVar1 = local_168._M_len;
  pcVar6 = local_168._M_str;
  if ((local_70.first.super_row_base<winmd::reader::Field>.m_table !=
       local_70.second.super_row_base<winmd::reader::Field>.m_table) ||
     (local_70.first.super_row_base<winmd::reader::Field>.m_index !=
      local_70.second.super_row_base<winmd::reader::Field>.m_index)) {
    local_138._0_8_ = (database *)0xe;
    local_138._8_8_ = "winrt::@::%<%>";
    ptVar7 = (table_base *)local_168._M_len;
    if ((table_base *)local_168._M_len == (table_base *)0x0) {
LAB_001489c7:
      local_90._0_8_ = (table_base *)0xffffffffffffffff;
    }
    else {
      do {
        local_90._0_8_ = &ptVar7[-1].field_0x27;
        if (ptVar7 == (table_base *)0x0) goto LAB_001489c7;
        pcVar6 = (undefined1 *)((long)&((database *)((long)local_168._M_str + -0x678))->m_cache + 7)
                 + (long)ptVar7;
        ptVar7 = (table_base *)local_90._0_8_;
      } while (*pcVar6 != '`');
    }
    if (local_168._M_len < (ulong)local_90._0_8_) {
      local_90._0_8_ = local_168._M_len;
    }
    local_90._8_8_ = local_168._M_str;
    local_40.delimiter = (string_view *)local_50;
    local_50._0_4_ = 2;
    local_50[4] = '\0';
    local_50[5] = '\0';
    local_50[6] = '\0';
    local_50[7] = '\0';
    local_50._8_8_ = ", ";
    local_40.list = &local_70;
    writer_base<cppwinrt::writer>::
    write_segment<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,cppwinrt::bind_list<std::pair<winmd::reader::GenericParam,winmd::reader::GenericParam>>(std::basic_string_view<char,std::char_traits<char>>const&,std::pair<winmd::reader::GenericParam,winmd::reader::GenericParam>const&)::_lambda(auto:1&)_1_>
              (&this->super_writer_base<cppwinrt::writer>,(string_view *)local_138,&local_158,
               (basic_string_view<char,_std::char_traits<char>_> *)local_90,&local_40);
    return (ssize_t)extraout_RAX;
  }
  if ((table_base *)local_168._M_len == (table_base *)0x7) {
    iVar3 = bcmp(local_168._M_str,"HResult",7);
    if ((iVar3 == 0) && (local_158._M_len == 0x12)) {
      iVar3 = bcmp(local_158._M_str,"Windows.Foundation",0x12);
      if (iVar3 == 0) {
        pcVar9 = (this->super_writer_base<cppwinrt::writer>).m_first.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        pcVar8 = "winrt::hresult";
        pcVar6 = "";
        goto LAB_00148b45;
      }
    }
LAB_001488b4:
    if (this->abi_types != true) {
      if (local_158._M_len == 0x1b) {
        iVar3 = bcmp(local_158._M_str,"Windows.Foundation.Numerics",0x1b);
        if (iVar3 == 0) {
          switch(&((table_base *)(sVar1 + -0x28))->field_0x23) {
          case (undefined1 *)0x0:
switchD_00148a6d_caseD_0:
            iVar3 = bcmp(pcVar6,"Plane",sVar1);
            if (iVar3 == 0) {
              local_168._M_len = 5;
              local_168._M_str = "plane";
              goto LAB_00148fdd;
            }
            if ((table_base *)sVar1 == (table_base *)0x7) goto switchD_00148a6d_caseD_2;
            if ((table_base *)sVar1 == (table_base *)0xa) goto switchD_00148a6d_caseD_5;
            break;
          case (undefined1 *)0x2:
switchD_00148a6d_caseD_2:
            iVar3 = bcmp(pcVar6,"Vector2",sVar1);
            if (iVar3 == 0) {
              local_168._M_len = 6;
              local_168._M_str = "float2";
            }
            else {
              if ((table_base *)sVar1 != (table_base *)0x7) break;
              iVar3 = bcmp(pcVar6,"Vector3",7);
              if (iVar3 == 0) {
                local_168._M_len = 6;
                local_168._M_str = "float3";
              }
              else {
                iVar3 = bcmp(pcVar6,"Vector4",7);
                if (iVar3 != 0) break;
                local_168._M_len = 6;
                local_168._M_str = "float4";
              }
            }
LAB_00148fdd:
            break;
          case (undefined1 *)0x4:
            iVar3 = bcmp(pcVar6,"Matrix3x2",sVar1);
            if (iVar3 == 0) {
              local_168._M_len = 8;
              local_168._M_str = "float3x2";
              goto LAB_00148fdd;
            }
            switch(&((table_base *)(sVar1 + -0x28))->field_0x23) {
            case (undefined1 *)0x0:
              goto switchD_00148a6d_caseD_0;
            case (undefined1 *)0x2:
              goto switchD_00148a6d_caseD_2;
            case (undefined1 *)0x4:
              iVar3 = bcmp(pcVar6,"Matrix4x4",sVar1);
              if (iVar3 == 0) {
                local_168._M_len = 8;
                local_168._M_str = "float4x4";
                goto LAB_00148fdd;
              }
              if ((table_base *)sVar1 == (table_base *)0xa) goto switchD_00148a6d_caseD_5;
              if ((table_base *)sVar1 == (table_base *)0x7) goto switchD_00148a6d_caseD_2;
              if ((table_base *)sVar1 == (table_base *)0x5) goto switchD_00148a6d_caseD_0;
              break;
            case (undefined1 *)0x5:
              goto switchD_00148a6d_caseD_5;
            }
            break;
          case (undefined1 *)0x5:
switchD_00148a6d_caseD_5:
            iVar3 = bcmp(pcVar6,"Quaternion",sVar1);
            if (iVar3 == 0) {
              local_168._M_len = 10;
              local_168._M_str = "quaternion";
              goto LAB_00148fdd;
            }
            if ((table_base *)sVar1 == (table_base *)0x7) goto switchD_00148a6d_caseD_2;
          }
        }
      }
switchD_00148a6d_caseD_1:
LAB_00149001:
      local_138._8_8_ = "winrt::@::%";
      local_138._0_8_ = (database *)0xb;
      writer_base<cppwinrt::writer>::
      write_segment<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                (&this->super_writer_base<cppwinrt::writer>,(string_view *)local_138,&local_158,
                 &local_168);
      return (ssize_t)extraout_RAX_04;
    }
    cVar4 = winmd::reader::get_category((TypeDef *)this_00);
    sVar1 = local_158._M_len;
    pcVar6 = local_158._M_str;
    first = extraout_RDX;
    if ((local_158._M_len == 0x1b) &&
       (iVar3 = bcmp(local_158._M_str,"Windows.Foundation.Numerics",0x1b), first = extraout_RDX_00,
       iVar3 == 0)) {
      puVar10 = (undefined1 *)
                ((long)&((basic_string_view<char,_std::char_traits<char>_> *)
                        (local_168._M_len + -0x10))->_M_str + 3);
      first = (basic_string_view<char,_std::char_traits<char>_> *)local_168._M_len;
      if (puVar10 < (undefined1 *)0x6) {
        local_148 = local_168._M_str;
        value = (coded_index<winmd::reader::TypeOrMethodDef> *)
                ((long)&switchD_00148b7c::switchdataD_00176538 +
                (long)(int)(&switchD_00148b7c::switchdataD_00176538)[(long)puVar10]);
        switch(puVar10) {
        case (undefined1 *)0x0:
switchD_00148b7c_caseD_0:
          iVar3 = bcmp(local_148,"Plane",(size_t)first);
          if (iVar3 == 0) {
            local_168._M_len = 5;
            local_168._M_str = "plane";
            goto LAB_0014902a;
          }
          if (first == (basic_string_view<char,_std::char_traits<char>_> *)0x7)
          goto switchD_00148b7c_caseD_2;
          if (first == (basic_string_view<char,_std::char_traits<char>_> *)0xa)
          goto switchD_00148b7c_caseD_5;
          break;
        case (undefined1 *)0x2:
switchD_00148b7c_caseD_2:
          iVar3 = bcmp(local_148,"Vector2",(size_t)first);
          if (iVar3 == 0) {
            local_168._M_len = 6;
            local_168._M_str = "float2";
          }
          else {
            bVar11 = first != (basic_string_view<char,_std::char_traits<char>_> *)0x7;
            first = extraout_RDX_03;
            if (bVar11) break;
            iVar3 = bcmp(local_148,"Vector3",7);
            if (iVar3 == 0) {
              local_168._M_len = 6;
              local_168._M_str = "float3";
            }
            else {
              iVar3 = bcmp(local_148,"Vector4",7);
              first = extraout_RDX_04;
              if (iVar3 != 0) break;
              local_168._M_len = 6;
              local_168._M_str = "float4";
            }
          }
LAB_0014902a:
          goto LAB_00149001;
        case (undefined1 *)0x4:
          local_140 = (basic_string_view<char,_std::char_traits<char>_> *)local_168._M_len;
          iVar3 = bcmp(local_168._M_str,"Matrix3x2",local_168._M_len);
          first = local_140;
          if (iVar3 == 0) {
            local_168._M_len = 8;
            local_168._M_str = "float3x2";
            goto LAB_0014902a;
          }
          if (puVar10 < (undefined1 *)0x6) {
            value = (coded_index<winmd::reader::TypeOrMethodDef> *)
                    ((long)&switchD_00148d20::switchdataD_00176550 +
                    (long)(int)(&switchD_00148d20::switchdataD_00176550)[(long)puVar10]);
            switch(puVar10) {
            case (undefined1 *)0x0:
              goto switchD_00148b7c_caseD_0;
            case (undefined1 *)0x2:
              goto switchD_00148b7c_caseD_2;
            case (undefined1 *)0x4:
              iVar3 = bcmp(local_148,"Matrix4x4",(size_t)local_140);
              if (iVar3 == 0) {
                local_168._M_len = 8;
                local_168._M_str = "float4x4";
                goto LAB_0014902a;
              }
              if (first == (basic_string_view<char,_std::char_traits<char>_> *)0xa)
              goto switchD_00148b7c_caseD_5;
              if (first == (basic_string_view<char,_std::char_traits<char>_> *)0x7)
              goto switchD_00148b7c_caseD_2;
              if (first == (basic_string_view<char,_std::char_traits<char>_> *)0x5)
              goto switchD_00148b7c_caseD_0;
              break;
            case (undefined1 *)0x5:
switchD_00148b7c_caseD_5:
              iVar3 = bcmp(local_148,"Quaternion",(size_t)first);
              if (iVar3 == 0) {
                local_168._M_len = 10;
                local_168._M_str = "quaternion";
                goto LAB_0014902a;
              }
              if (first == (basic_string_view<char,_std::char_traits<char>_> *)0x7)
              goto switchD_00148b7c_caseD_2;
            }
          }
          break;
        case (undefined1 *)0x5:
          goto switchD_00148b7c_caseD_5;
        }
      }
    }
    if (cVar4 == enum_type) {
      winmd::reader::row_base<winmd::reader::TypeDef>::get_list<winmd::reader::Field>
                ((pair<winmd::reader::Field,_winmd::reader::Field> *)local_90,this_00,4);
      winmd::reader::Field::Signature((FieldSig *)local_138,(Field *)local_90);
      write(this,(int)local_128 + 0x10,__buf_00,(size_t)value);
      if (local_a8 != (pointer)0x0) {
        operator_delete(local_a8,(long)local_98 - (long)local_a8);
      }
      std::__detail::__variant::
      _Variant_storage<false,_winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
      ::~_Variant_storage(&local_f0);
      pdVar5 = extraout_RAX_00;
      if ((pointer)local_128._24_8_ != (pointer)0x0) {
        operator_delete((void *)local_128._24_8_,(long)local_100 - local_128._24_8_);
        pdVar5 = extraout_RAX_01;
      }
      if ((database *)local_138._8_8_ == (database *)0x0) {
        return (ssize_t)pdVar5;
      }
      puVar10 = (undefined1 *)(local_128._8_8_ - local_138._8_8_);
      pdVar5 = (database *)local_138._8_8_;
    }
    else {
      if (cVar4 != struct_type) {
        pcVar9 = (this->super_writer_base<cppwinrt::writer>).m_first.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        pcVar8 = "void*";
        pcVar6 = "";
        goto LAB_00148b45;
      }
      pcVar8 = local_168._M_str;
      if (local_168._M_len == 4) {
        iVar3 = bcmp(local_168._M_str,"Size",4);
        first = extraout_RDX_07;
        if (iVar3 == 0) {
LAB_00148e77:
          if (sVar1 != 0x12) goto LAB_00148e97;
        }
        else {
          iVar3 = bcmp(pcVar8,"Rect",4);
          first = extraout_RDX_08;
          if ((sVar1 != 0x12) || (iVar3 != 0)) goto LAB_00148e97;
        }
        iVar3 = bcmp(pcVar6,"Windows.Foundation",sVar1);
        first = extraout_RDX_09;
        if (iVar3 == 0) goto switchD_00148a6d_caseD_1;
      }
      else if (local_168._M_len == 5) {
        iVar3 = bcmp(local_168._M_str,"Point",5);
        first = extraout_RDX_06;
        if (iVar3 == 0) goto LAB_00148e77;
      }
      else if (local_168._M_len == 8) {
        iVar3 = bcmp(local_168._M_str,"DateTime",8);
        if (iVar3 == 0) {
          first = extraout_RDX_01;
          if (sVar1 == 0x12) goto LAB_00148dfb;
        }
        else {
          iVar3 = bcmp(pcVar8,"TimeSpan",8);
          first = extraout_RDX_02;
          if ((sVar1 == 0x12) && (iVar3 == 0)) {
LAB_00148dfb:
            iVar3 = bcmp(pcVar6,"Windows.Foundation",sVar1);
            first = extraout_RDX_05;
            if (iVar3 == 0) {
              pcVar9 = (this->super_writer_base<cppwinrt::writer>).m_first.
                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              pcVar8 = "int64_t";
              pcVar6 = "";
              goto LAB_00148b45;
            }
          }
        }
      }
LAB_00148e97:
      if (this->delegate_types == true) {
        local_90._0_8_ = (table_base *)0x17;
        local_90._8_8_ = "struct impl::struct_%_%";
        get_impl_name<std::basic_string_view<char,std::char_traits<char>>>
                  ((string *)local_138,(cppwinrt *)&local_158,first);
        writer_base<cppwinrt::writer>::
        write_segment<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                  (&this->super_writer_base<cppwinrt::writer>,(string_view *)local_90,
                   (string *)local_138,&local_168);
      }
      else {
        local_90._0_8_ = (table_base *)0x11;
        local_90._8_8_ = "struct struct_%_%";
        get_impl_name<std::basic_string_view<char,std::char_traits<char>>>
                  ((string *)local_138,(cppwinrt *)&local_158,first);
        writer_base<cppwinrt::writer>::
        write_segment<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                  (&this->super_writer_base<cppwinrt::writer>,(string_view *)local_90,
                   (string *)local_138,&local_168);
      }
      if ((database *)local_138._0_8_ == (database *)local_128) {
        return (ssize_t)(database *)local_128;
      }
      puVar10 = (undefined1 *)(local_128._0_8_ + 1);
      pdVar5 = (database *)local_138._0_8_;
    }
    operator_delete(pdVar5,(ulong)puVar10);
    pdVar5 = extraout_RAX_03;
  }
  else {
    if ((((table_base *)local_168._M_len != (table_base *)0x16) ||
        (iVar3 = bcmp(local_168._M_str,"EventRegistrationToken",0x16), iVar3 != 0)) ||
       (local_158._M_len != 0x12)) goto LAB_001488b4;
    iVar3 = bcmp(local_158._M_str,"Windows.Foundation",0x12);
    if (iVar3 != 0) goto LAB_001488b4;
    pcVar9 = (this->super_writer_base<cppwinrt::writer>).m_first.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    pcVar8 = "winrt::event_token";
    pcVar6 = "";
LAB_00148b45:
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              ((vector<char,std::allocator<char>> *)
               &(this->super_writer_base<cppwinrt::writer>).m_first,pcVar9,pcVar8,pcVar6);
    pdVar5 = extraout_RAX_02;
  }
  return (ssize_t)pdVar5;
}

Assistant:

void write(TypeDef const& type)
        {
            add_depends(type);
            auto ns = type.TypeNamespace();
            auto name = type.TypeName();
            auto generics = type.GenericParam();

            if (!empty(generics))
            {
                write("winrt::@::%<%>", ns, remove_tick(name), bind_list(", ", generics));
                return;
            }

            if (name == "EventRegistrationToken" && ns == "Windows.Foundation")
            {
                write("winrt::event_token");
            }
            else if (name == "HResult" && ns == "Windows.Foundation")
            {
                write("winrt::hresult");
            }
            else if (abi_types)
            {
                auto category = get_category(type);

                if (ns == "Windows.Foundation.Numerics" && transform_special_numeric_type(name))
                {
                    write("winrt::@::%", ns, name);
                }
                else if (category == category::struct_type)
                {
                    if ((name == "DateTime" || name == "TimeSpan") && ns == "Windows.Foundation")
                    {
                        write("int64_t");
                    }
                    else if ((name == "Point" || name == "Size" || name == "Rect") && ns == "Windows.Foundation")
                    {
                        write("winrt::@::%", ns, name);
                    }
                    else if (delegate_types)
                    {
                        write("struct impl::struct_%_%", get_impl_name(ns), name);
                    }
                    else
                    {
                        write("struct struct_%_%", get_impl_name(ns), name);
                    }
                }
                else if (category == category::enum_type)
                {
                    write(type.FieldList().first.Signature().Type());
                }
                else
                {
                    write("void*");
                }
            }
            else
            {
                if (ns == "Windows.Foundation.Numerics")
                {
                    if (name == "Matrix3x2") { name = "float3x2"; }
                    else if (name == "Matrix4x4") { name = "float4x4"; }
                    else if (name == "Plane") { name = "plane"; }
                    else if (name == "Quaternion") { name = "quaternion"; }
                    else if (name == "Vector2") { name = "float2"; }
                    else if (name == "Vector3") { name = "float3"; }
                    else if (name == "Vector4") { name = "float4"; }

                    write("winrt::@::%", ns, name);
                }
                else
                {
                    write("winrt::@::%", ns, name);
                }
            }
        }